

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

int Au_ObjSuppSize(Au_Obj_t *pObj)

{
  Au_Ntk_t *p;
  int iVar1;
  int iVar2;
  int *__s;
  int iVar3;
  ulong uVar4;
  
  p = *(Au_Ntk_t **)((ulong)pObj & 0xfffffffffffffc00);
  if ((p->vTravIds).pArray == (int *)0x0) {
    iVar2 = p->iHandle;
    iVar1 = (p->vPages).nSize * 0x1000 + -0x1000;
    uVar4 = (long)iVar2 + (long)iVar1 + 500;
    iVar3 = (int)uVar4;
    if ((p->vTravIds).nCap < iVar3) {
      __s = (int *)malloc(uVar4 * 4);
      (p->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vTravIds).nCap = iVar3;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar1 + iVar2) {
      memset(__s,0,(uVar4 & 0xffffffff) << 2);
    }
    (p->vTravIds).nSize = iVar3;
  }
  iVar2 = p->nTravIds;
  p->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    iVar2 = Au_ObjSuppSize_rec(p,(uint)((ulong)pObj >> 4) & 0x3f |
                                 *(uint *)((long)pObj + (8 - (ulong)((uint)pObj & 0x3ff))));
    return iVar2;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                ,0xbf,"void Au_NtkIncrementTravId(Au_Ntk_t *)");
}

Assistant:

int Au_ObjSuppSize( Au_Obj_t * pObj )
{
    Au_Ntk_t * p = Au_ObjNtk(pObj);
    Au_NtkIncrementTravId( p );
    return Au_ObjSuppSize_rec( p, Au_ObjId(pObj) );
}